

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::nextOverlap
          (overlap_iterator *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_5U,_true>_> *pNVar3;
  uint32_t *puVar4;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_5U,_true>_> *in_RDI;
  uint32_t size;
  uint32_t *offset;
  overlap_iterator *in_stack_00000020;
  uint32_t l;
  Path *path;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe8;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_5U,_true>_> *this_00;
  
  pNVar3 = in_RDI + 8;
  this_00 = in_RDI;
  uVar1 = IntervalMapDetails::Path::height((Path *)in_RDI);
  do {
    do {
      uVar2 = IntervalMapDetails::Path::height((Path *)in_RDI);
      if (uVar2 == 0) {
        puVar4 = IntervalMapDetails::Path::leafOffset((Path *)0x8170ef);
        *puVar4 = *puVar4 + 1;
        return;
      }
      IntervalMapDetails::Path::pop((Path *)0x81700d);
      uVar1 = uVar1 - 1;
      puVar4 = IntervalMapDetails::Path::leafOffset((Path *)0x817022);
      uVar2 = IntervalMapDetails::Path::leafSize((Path *)0x817031);
    } while (uVar2 - 1 <= *puVar4);
    if (uVar1 == 0) {
      IntervalMapDetails::Path::node<slang::IntervalMapDetails::BranchNode<unsigned_long,5u,true>>
                ((Path *)in_RDI,in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffcc =
           IntervalMapDetails::
           NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_5U,_true>_>
           ::findFirstOverlap(this_00,(uint32_t)((ulong)pNVar3 >> 0x20),(uint32_t)pNVar3,
                              (interval<unsigned_long> *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    }
    else {
      IntervalMapDetails::Path::node<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                ((Path *)in_RDI,in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffcc =
           IntervalMapDetails::
           NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
           ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                               *)this_00,(uint32_t)((ulong)pNVar3 >> 0x20),(uint32_t)pNVar3,
                              (interval<unsigned_long> *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    }
    *puVar4 = in_stack_ffffffffffffffcc;
  } while (*puVar4 == uVar2);
  treeFind(in_stack_00000020);
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::nextOverlap() {
    auto& path = this->path;
    SLANG_ASSERT(path.leafOffset() == path.leafSize());
    SLANG_ASSERT(valid());

    // Pop up a level and try to move forward. Keep going until we
    // find a new branch that overlaps our target key.
    uint32_t l = path.height();
    while (path.height()) {
        path.pop();
        --l;

        uint32_t& offset = path.leafOffset();
        uint32_t size = path.leafSize();
        if (offset < size - 1) {
            offset = l == 0 ? path.template node<RootBranch>(l).findFirstOverlap(offset + 1, size,
                                                                                 searchKey)
                            : path.template node<Branch>(l).findFirstOverlap(offset + 1, size,
                                                                             searchKey);
            if (offset != size) {
                // Descend back down to the next overlapping leaf node from our current position.
                treeFind();
                return;
            }
        }
    }

    // If we hit this point we ran out places to look. We should be right
    // before the last node in the root branch so bump our offset by one
    // to make the path point to the end of the tree.
    SLANG_ASSERT(path.height() == 0);
    path.leafOffset()++;
}